

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif_parse.cc
# Opt level: O2

void yydestruct(char *yymsg,yysymbol_kind_t yykind,YYSTYPE *yyvaluep)

{
  char *pcVar1;
  YYSTYPE *yyvaluep_00;
  
  if (yydebug == 0) {
    return;
  }
  pcVar1 = "Deleting";
  if (yymsg != (char *)0x0) {
    pcVar1 = yymsg;
  }
  fprintf(_stderr,"%s ",pcVar1);
  yy_symbol_print((FILE *)_stderr,yykind,yyvaluep_00);
  fputc(10,_stderr);
  return;
}

Assistant:

static void
yydestruct (const char *yymsg,
            yysymbol_kind_t yykind, YYSTYPE *yyvaluep)
{
  YY_USE (yyvaluep);
  if (!yymsg)
    yymsg = "Deleting";
  YY_SYMBOL_PRINT (yymsg, yykind, yyvaluep, yylocationp);

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  YY_USE (yykind);
  YY_IGNORE_MAYBE_UNINITIALIZED_END
}